

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase827::run(TestCase827 *this)

{
  Builder builder;
  Builder builder_00;
  void *__buf;
  int in_R8D;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 local_230 [8];
  Client castClient3;
  Client castClient2;
  Client castClient;
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  local_1e0;
  undefined1 local_1a8 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:839:38),_capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>_>
  promise;
  BuilderFor<capnp::AnyPointer> local_170;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_158;
  Builder local_130;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> local_108;
  ArrayPtr<const_char> local_e0;
  Maybe<capnp::MessageSize> local_d0;
  undefined1 local_b8 [8];
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  request;
  Client client;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase827 *this_local;
  
  kj::EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  kj::WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::Client
            ((Client *)&request.hook.ptr,(void *)0x0);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_d0,(void *)0x0);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::callRequest
            ((Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
              *)local_b8,(Client *)&request.hook.ptr,&local_d0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_d0);
  Text::Reader::Reader((Reader *)&local_e0,"hello");
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>::
  Builder::setBaz((Builder *)local_b8,(ReaderFor<capnp::Text>)local_e0);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>::
  Builder::initInnerBound(&local_130,(Builder *)local_b8);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner::Builder::
  initFoo(&local_108,&local_130);
  builder._builder.capTable = (CapTableBuilder *)local_108._builder.data;
  builder._builder.segment = (SegmentBuilder *)local_108._builder.capTable;
  builder._builder.data = local_108._builder.pointers;
  builder._builder.pointers = (WirePointer *)local_108._builder._32_8_;
  builder._builder.dataSize = (int)in_stack_fffffffffffffdc0;
  builder._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffdc0 >> 0x30);
  initTestMessage(builder);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>::
  Builder::initInnerUnbound((Builder *)&promise.super_PromiseBase.node.ptr,(Builder *)local_b8);
  capnproto_test::capnp::test::TestGenerics<capnp::AnyPointer,_capnp::AnyPointer>::Inner::Builder::
  getFoo(&local_170,(Builder *)&promise.super_PromiseBase.node.ptr);
  AnyPointer::Builder::initAs<capnproto_test::capnp::test::TestAllTypes>(&local_158,&local_170);
  builder_00._builder.capTable = (CapTableBuilder *)local_158._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_158._builder.capTable;
  builder_00._builder.data = local_158._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_158._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffdc0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffdc0 >> 0x30);
  initTestMessage(builder_00);
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  ::send(&local_1e0,(int)local_b8,__buf,local_158._builder._32_8_,in_R8D);
  kj::
  Promise<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::CallResults>>
  ::
  then<capnp::_::(anonymous_namespace)::TestCase827::run()::__0,capnp::_::(anonymous_namespace)::TestCase827::run()::__1>
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::CallResults>>
              *)local_1a8,(Type *)&local_1e0,(Type *)&castClient.field_0x17);
  RemotePromise<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  ::~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
                    *)&local_1e0);
  kj::Promise<void>::wait((Promise<void> *)local_1a8,local_58);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::asGeneric<capnp::AnyPointer>
            ((Client *)&castClient2.field_0x10,(Client *)&request.hook.ptr);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::
  asGeneric<capnproto_test::capnp::test::TestAllTypes>
            ((Client *)&castClient3.field_0x10,(Client *)&request.hook.ptr);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,(capnp::Kind)0>>::Client::
  asTestGenericsGeneric<capnp::AnyPointer,capnp::AnyPointer>((Client *)local_230,&request.hook.ptr);
  capnproto_test::capnp::test::TestGenerics<capnp::AnyPointer,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::~Client((Client *)local_230);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnproto_test::capnp::test::TestAllTypes>::Client::~Client
            ((Client *)&castClient3.field_0x10);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::AnyPointer>::Client::~Client((Client *)&castClient2.field_0x10);
  kj::Promise<void>::~Promise((Promise<void> *)local_1a8);
  Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
  ::~Request((Request<capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Inner2<capnp::Text>,_capnproto_test::capnp::test::TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::CallResults>
              *)local_b8);
  capnproto_test::capnp::test::
  TestGenerics<capnproto_test::capnp::test::TestAllTypes,_capnp::AnyPointer>::
  Interface<capnp::List<unsigned_int,_(capnp::Kind)0>_>::Client::~Client
            ((Client *)&request.hook.ptr);
  kj::WaitScope::~WaitScope((WaitScope *)local_58);
  kj::EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Capability, Generics) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  typedef test::TestGenerics<TestAllTypes>::Interface<List<uint32_t>> Interface;
  Interface::Client client = nullptr;

  auto request = client.callRequest();
  request.setBaz("hello");
  initTestMessage(request.initInnerBound().initFoo());
  initTestMessage(request.initInnerUnbound().getFoo().initAs<TestAllTypes>());

  auto promise = request.send().then([](capnp::Response<Interface::CallResults>&& response) {
    // This doesn't actually execute; we're just checking that it compiles.
    List<uint32_t>::Reader qux = response.getQux();
    qux.size();
    checkTestMessage(response.getGen().getFoo());
  }, [](kj::Exception&& e) {
    // Ignore exception (which we'll always get because we're calling a null capability).
  });

  promise.wait(waitScope);

  // Check that asGeneric<>() compiles.
  test::TestGenerics<TestAllTypes>::Interface<>::Client castClient = client.asGeneric<>();
  test::TestGenerics<TestAllTypes>::Interface<TestAllTypes>::Client castClient2 =
      client.asGeneric<TestAllTypes>();
  test::TestGenerics<>::Interface<List<uint32_t>>::Client castClient3 = client.asTestGenericsGeneric<>();
}